

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdInParse.cpp
# Opt level: O0

int main(int argC,char **argV)

{
  int iVar1;
  char *__s1;
  SAXParser *this;
  ulong uVar2;
  XMLCh *toTranscode;
  ostream *poVar3;
  XMLSize_t XVar4;
  char *pcVar5;
  code *pcVar6;
  DocumentHandler *local_140;
  DTDHandler *local_130;
  StrX local_108 [2];
  OutOfMemoryException *anon_var_0;
  XMLException *e;
  unsigned_long endMillis;
  unsigned_long startMillis;
  StdInInputSource src;
  int errorCount;
  unsigned_long duration;
  StdInParseHandlers handler;
  SAXParser *parser;
  char *parm;
  int parmInd;
  XMLException *toCatch;
  char **argV_local;
  int argC_local;
  
  argV_local._4_4_ = 0;
  pcVar5 = (char *)0x0;
  xercesc_4_0::XMLPlatformUtils::Initialize
            ((char *)&xercesc_4_0::XMLUni::fgXercescDefaultLocale,(char *)0x0,(PanicHandler *)0x0,
             (MemoryManager *)0x0);
  parm._4_4_ = 1;
  do {
    if ((argC <= parm._4_4_) || (*argV[parm._4_4_] != '-')) {
      this = (SAXParser *)xercesc_4_0::XMemory::operator_new((XMemory *)0x108,(ulong)pcVar5);
      xercesc_4_0::SAXParser::SAXParser
                (this,(XMLValidator *)0x0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager,
                 (XMLGrammarPool *)0x0);
      handler.fSpaceCount = (XMLSize_t)this;
      xercesc_4_0::SAXParser::setValidationScheme((ValSchemes)this);
      xercesc_4_0::SAXParser::setDoNamespaces(SUB81(handler.fSpaceCount,0));
      xercesc_4_0::SAXParser::setDoSchema(SUB81(handler.fSpaceCount,0));
      xercesc_4_0::SAXParser::setHandleMultipleImports(SUB81(handler.fSpaceCount,0));
      xercesc_4_0::SAXParser::setValidationSchemaFullChecking(SUB81(handler.fSpaceCount,0));
      StdInParseHandlers::StdInParseHandlers((StdInParseHandlers *)&duration);
      local_130 = (DTDHandler *)0x0;
      if (&stack0x00000000 != (undefined1 *)0x90) {
        local_130 = &handler.super_HandlerBase.super_DTDHandler;
      }
      (**(code **)(*(long *)handler.fSpaceCount + 0x20))(handler.fSpaceCount,local_130);
      local_140 = (DocumentHandler *)0x0;
      if (&stack0x00000000 != (undefined1 *)0x90) {
        local_140 = &handler.super_HandlerBase.super_DocumentHandler;
      }
      (**(code **)(*(long *)handler.fSpaceCount + 0x28))(handler.fSpaceCount,local_140);
      src._44_4_ = 0;
      xercesc_4_0::StdInInputSource::StdInInputSource
                ((StdInInputSource *)&startMillis,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      endMillis = xercesc_4_0::XMLPlatformUtils::getCurrentMillis();
      (**(code **)(*(long *)handler.fSpaceCount + 0x30))(handler.fSpaceCount,&startMillis);
      e = (XMLException *)xercesc_4_0::XMLPlatformUtils::getCurrentMillis();
      uVar2 = (long)e - endMillis;
      src._44_4_ = xercesc_4_0::SAXParser::getErrorCount();
      if (src._44_4_ == 0) {
        toTranscode = xercesc_4_0::InputSource::getSystemId((InputSource *)&startMillis);
        StrX::StrX(local_108,toTranscode);
        poVar3 = operator<<((ostream *)&std::cout,local_108);
        poVar3 = std::operator<<(poVar3,": ");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,uVar2);
        poVar3 = std::operator<<(poVar3," ms (");
        XVar4 = StdInParseHandlers::getElementCount((StdInParseHandlers *)&duration);
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,XVar4);
        poVar3 = std::operator<<(poVar3," elems, ");
        XVar4 = StdInParseHandlers::getAttrCount((StdInParseHandlers *)&duration);
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,XVar4);
        poVar3 = std::operator<<(poVar3," attrs, ");
        XVar4 = StdInParseHandlers::getSpaceCount((StdInParseHandlers *)&duration);
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,XVar4);
        poVar3 = std::operator<<(poVar3," spaces, ");
        XVar4 = StdInParseHandlers::getCharacterCount((StdInParseHandlers *)&duration);
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,XVar4);
        poVar3 = std::operator<<(poVar3," chars)");
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        StrX::~StrX(local_108);
      }
      anon_var_0._4_4_ = 0;
      xercesc_4_0::StdInInputSource::~StdInInputSource((StdInInputSource *)&startMillis);
      if (anon_var_0._4_4_ == 0) {
        if (handler.fSpaceCount != 0) {
          (**(code **)(*(long *)handler.fSpaceCount + 8))();
        }
        xercesc_4_0::XMLPlatformUtils::Terminate();
        if ((int)src._44_4_ < 1) {
          argV_local._4_4_ = 0;
          anon_var_0._4_4_ = 1;
        }
        else {
          argV_local._4_4_ = 4;
          anon_var_0._4_4_ = 1;
        }
      }
      StdInParseHandlers::~StdInParseHandlers((StdInParseHandlers *)&duration);
      return argV_local._4_4_;
    }
    iVar1 = strcmp(argV[parm._4_4_],"-?");
    if (iVar1 == 0) {
      usage();
      xercesc_4_0::XMLPlatformUtils::Terminate();
      return 2;
    }
    iVar1 = strncmp(argV[parm._4_4_],"-v=",3);
    if ((iVar1 == 0) || (iVar1 = strncmp(argV[parm._4_4_],"-V=",3), iVar1 == 0)) {
      __s1 = argV[parm._4_4_] + 3;
      pcVar5 = "never";
      iVar1 = strcmp(__s1,"never");
      if (iVar1 == 0) {
        valScheme = Val_Never;
      }
      else {
        pcVar5 = "auto";
        iVar1 = strcmp(__s1,"auto");
        if (iVar1 == 0) {
          valScheme = Val_Auto;
        }
        else {
          pcVar5 = "always";
          iVar1 = strcmp(__s1,"always");
          if (iVar1 != 0) {
            poVar3 = std::operator<<((ostream *)&std::cerr,"Unknown -v= value: ");
            poVar3 = std::operator<<(poVar3,__s1);
            std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
            xercesc_4_0::XMLPlatformUtils::Terminate();
            return 2;
          }
          valScheme = Val_Always;
        }
      }
    }
    else {
      pcVar5 = "-n";
      iVar1 = strcmp(argV[parm._4_4_],"-n");
      if (iVar1 != 0) {
        pcVar5 = "-N";
        iVar1 = strcmp(argV[parm._4_4_],"-N");
        if (iVar1 != 0) {
          pcVar5 = "-s";
          iVar1 = strcmp(argV[parm._4_4_],"-s");
          if (iVar1 != 0) {
            pcVar5 = "-S";
            iVar1 = strcmp(argV[parm._4_4_],"-S");
            if (iVar1 != 0) {
              pcVar5 = "-f";
              iVar1 = strcmp(argV[parm._4_4_],"-f");
              if (iVar1 != 0) {
                pcVar5 = "-F";
                iVar1 = strcmp(argV[parm._4_4_],"-F");
                if (iVar1 != 0) {
                  poVar3 = std::operator<<((ostream *)&std::cerr,"Unknown option \'");
                  poVar3 = std::operator<<(poVar3,argV[parm._4_4_]);
                  poVar3 = std::operator<<(poVar3,"\', ignoring it\n");
                  pcVar6 = std::endl<char,std::char_traits<char>>;
                  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
                  pcVar5 = (char *)pcVar6;
                  goto LAB_001057b9;
                }
              }
              schemaFullChecking = true;
              goto LAB_001057b9;
            }
          }
          doSchema = true;
          goto LAB_001057b9;
        }
      }
      doNamespaces = true;
    }
LAB_001057b9:
    parm._4_4_ = parm._4_4_ + 1;
  } while( true );
}

Assistant:

int main(int argC, char* argV[])
{
    // Initialize the XML4C system
    try
    {
         XMLPlatformUtils::Initialize();
    }

    catch (const XMLException& toCatch)
    {
         std::cerr << "Error during initialization! Message:\n"
              << StrX(toCatch.getMessage()) << std::endl;
         return 1;
    }

    int parmInd;
    for (parmInd = 1; parmInd < argC; parmInd++)
    {
        // Break out on first parm not starting with a dash
        if (argV[parmInd][0] != '-')
            break;

        // Watch for special case help request
        if (!strcmp(argV[parmInd], "-?"))
        {
            usage();
            XMLPlatformUtils::Terminate();
            return 2;
        }
         else if (!strncmp(argV[parmInd], "-v=", 3)
              ||  !strncmp(argV[parmInd], "-V=", 3))
        {
            const char* const parm = &argV[parmInd][3];

            if (!strcmp(parm, "never"))
                valScheme = SAXParser::Val_Never;
            else if (!strcmp(parm, "auto"))
                valScheme = SAXParser::Val_Auto;
            else if (!strcmp(parm, "always"))
                valScheme = SAXParser::Val_Always;
            else
            {
                std::cerr << "Unknown -v= value: " << parm << std::endl;
                XMLPlatformUtils::Terminate();
                return 2;
            }
        }
         else if (!strcmp(argV[parmInd], "-n")
              ||  !strcmp(argV[parmInd], "-N"))
        {
            doNamespaces = true;
        }
         else if (!strcmp(argV[parmInd], "-s")
              ||  !strcmp(argV[parmInd], "-S"))
        {
            doSchema = true;
        }
         else if (!strcmp(argV[parmInd], "-f")
              ||  !strcmp(argV[parmInd], "-F"))
        {
            schemaFullChecking = true;
        }
         else
        {
            std::cerr << "Unknown option '" << argV[parmInd]
                 << "', ignoring it\n" << std::endl;
        }
    }

    //
    //  Create a SAX parser object. Then, according to what we were told on
    //  the command line, set the options.
    //
    SAXParser* parser = new SAXParser;
    parser->setValidationScheme(valScheme);
    parser->setDoNamespaces(doNamespaces);
    parser->setDoSchema(doSchema);
    parser->setHandleMultipleImports (true);
    parser->setValidationSchemaFullChecking(schemaFullChecking);


    //
    //  Create our SAX handler object and install it on the parser, as the
    //  document and error handler. We are responsible for cleaning them
    //  up, but since its just stack based here, there's nothing special
    //  to do.
    //
    StdInParseHandlers handler;
    parser->setDocumentHandler(&handler);
    parser->setErrorHandler(&handler);

    unsigned long duration;
    int errorCount = 0;
    // create a faux scope so that 'src' destructor is called before
    // XMLPlatformUtils::Terminate
    {
        //
        //  Kick off the parse and catch any exceptions. Create a standard
        //  input input source and tell the parser to parse from that.
        //
        StdInInputSource src;
        try
        {
            const unsigned long startMillis = XMLPlatformUtils::getCurrentMillis();
            parser->parse(src);
            const unsigned long endMillis = XMLPlatformUtils::getCurrentMillis();
            duration = endMillis - startMillis;
            errorCount = parser->getErrorCount();
        }
        catch (const OutOfMemoryException&)
        {
            std::cerr << "OutOfMemoryException" << std::endl;
            errorCount = 2;
            return 4;
        }
        catch (const XMLException& e)
        {
            std::cerr << "\nError during parsing: \n"
                 << StrX(e.getMessage())
                 << "\n" << std::endl;
            errorCount = 1;
            return 4;
        }

        // Print out the stats that we collected and time taken
        if (!errorCount) {
            std::cout << StrX(src.getSystemId()) << ": " << duration << " ms ("
                 << handler.getElementCount() << " elems, "
                 << handler.getAttrCount() << " attrs, "
                 << handler.getSpaceCount() << " spaces, "
                 << handler.getCharacterCount() << " chars)" << std::endl;
        }
    }

    //
    //  Delete the parser itself.  Must be done prior to calling Terminate, below.
    //
    delete parser;

    XMLPlatformUtils::Terminate();

    if (errorCount > 0)
        return 4;
    else
        return 0;
}